

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O2

ixy_device * virtio_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined2 *puVar3;
  undefined2 *puVar4;
  FILE *pFVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  __uid_t _Var9;
  int iVar10;
  uint32_t uVar11;
  virtio_device *dev;
  char *pcVar12;
  void *__s;
  uint *puVar13;
  void *pvVar14;
  mempool *pmVar15;
  ulong uVar16;
  undefined8 uVar17;
  size_t offset;
  size_t offset_00;
  size_t offset_01;
  size_t offset_02;
  size_t sVar18;
  char *pcVar19;
  long lVar20;
  dma_memory dVar21;
  undefined8 uStackY_60;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar22;
  
  _Var9 = getuid();
  if (_Var9 != 0) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): Not running as root, this will probably fail\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x147,"virtio_init");
  }
  if (rx_queues < 2) {
    if (tx_queues < 2) {
      remove_driver(pci_addr);
      dev = (virtio_device *)calloc(1,0xb0);
      pcVar12 = strdup(pci_addr);
      (dev->ixy).pci_addr = pcVar12;
      (dev->ixy).driver_name = "ixy-virtio";
      (dev->ixy).num_rx_queues = rx_queues;
      (dev->ixy).num_tx_queues = tx_queues;
      (dev->ixy).rx_batch = virtio_rx_batch;
      (dev->ixy).tx_batch = virtio_tx_batch;
      (dev->ixy).read_stats = virtio_read_stats;
      (dev->ixy).set_promisc = virtio_set_promisc;
      (dev->ixy).get_link_speed = virtio_get_link_speed;
      enable_dma(pci_addr);
      iVar10 = pci_open_resource(pci_addr,"config",0);
      uVar7 = read_io16(iVar10,2);
      close(iVar10);
      if (uVar7 == 0x1000) {
        fprintf(_stdout,"[INFO ] %s:%d %s(): Detected virtio legacy network card\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x160,"virtio_init");
        iVar10 = pci_open_resource(pci_addr,"resource0",2);
        dev->fd = iVar10;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): Configuring bar0\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x113,"virtio_legacy_init");
        sVar18 = 0;
        write_io8(iVar10,'\0',offset);
        while( true ) {
          uVar6 = read_io8(iVar10,sVar18);
          uVar22 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
          if (uVar6 == '\0') break;
          usleep(100);
        }
        write_io8(iVar10,'\x01',offset_00);
        write_io8(iVar10,'\x02',offset_01);
        uVar11 = read_io32(iVar10,0);
        fprintf(_stderr,"[DEBUG] %s:%d %s(): Host features: %x\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x11c,"virtio_legacy_init",(ulong)uVar11);
        pFVar5 = _stderr;
        if ((~uVar11 & 0x8060003) == 0) {
          uVar11 = read_io32(iVar10,4);
          fprintf(pFVar5,"[DEBUG] %s:%d %s(): Guest features before negotiation: %x\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                  ,0x123,"virtio_legacy_init",(ulong)uVar11);
          write_io32(iVar10,0x8060003,4);
          pFVar5 = _stderr;
          uVar11 = read_io32(iVar10,4);
          fprintf(pFVar5,"[DEBUG] %s:%d %s(): Guest features after negotiation: %x\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                  ,0x125,"virtio_legacy_init",(ulong)uVar11);
          write_io16(iVar10,0,0xe);
          uVar7 = read_io16(iVar10,0xc);
          uVar17 = CONCAT44(uVar22,(uint)uVar7);
          fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of rx queue #%u: %u\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                  ,0xe5,"virtio_legacy_setup_rx_queue",0,uVar17);
          if (uVar7 != 0) {
            uVar8 = read_io16(iVar10,0x10);
            fprintf(_stderr,"[DEBUG] %s:%d %s(): Notifcation offset %u\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                    ,0xea,"virtio_legacy_setup_rx_queue",(ulong)uVar8,uVar17);
            sVar18 = (ulong)((uint)uVar7 * 0x12 + 0x1003 & 0x3ff000) + 4 + (ulong)((uint)uVar7 * 8);
            dVar21 = memory_allocate_dma(sVar18,true);
            __s = dVar21.virt;
            memset(__s,0xab,sVar18);
            fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                    ,0xee,"virtio_legacy_setup_rx_queue",sVar18,__s);
            write_io32(dev->fd,(uint32_t)(dVar21.phy >> 0xc),8);
            puVar13 = (uint *)calloc(1,(ulong)((uint)uVar7 * 8) + 0x38);
            *puVar13 = (uint)uVar7;
            pFVar5 = _stderr;
            *(void **)(puVar13 + 2) = __s;
            pvVar14 = (void *)((ulong)uVar7 * 0x10 + (long)__s);
            *(void **)(puVar13 + 4) = pvVar14;
            uVar16 = (long)pvVar14 + (ulong)(uint)uVar7 * 2 + 0x1003 & 0xfffffffffffff000;
            *(ulong *)(puVar13 + 6) = uVar16;
            fprintf(pFVar5,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                    ,0xf4,"virtio_legacy_setup_rx_queue",__s,pvVar14,uVar16);
            uVar2 = *puVar13;
            for (lVar20 = 0; (ulong)uVar2 * 2 != lVar20; lVar20 = lVar20 + 2) {
              puVar1 = (undefined8 *)(*(long *)(puVar13 + 2) + lVar20 * 8);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined2 *)(*(long *)(puVar13 + 4) + 4 + lVar20) = 0;
              *(undefined8 *)(*(long *)(puVar13 + 6) + 4 + lVar20 * 4) = 0;
            }
            puVar3 = *(undefined2 **)(puVar13 + 6);
            puVar3[1] = 0;
            puVar4 = *(undefined2 **)(puVar13 + 4);
            puVar4[1] = 0;
            *(undefined2 *)(puVar13 + 10) = 0;
            *(ulong *)(puVar13 + 8) = (ulong)uVar8;
            *puVar4 = 1;
            *puVar3 = 0;
            pmVar15 = memory_allocate_mempool((uint)uVar7 << 2,0x800);
            *(mempool **)(puVar13 + 0xc) = pmVar15;
            dev->rx_queue = puVar13;
          }
          virtio_legacy_setup_tx_queue(dev,1);
          virtio_legacy_setup_tx_queue(dev,2);
          iVar10 = dev->fd;
          write_io8(iVar10,'\x04',offset_02);
          pcVar12 = "[INFO ] %s:%d %s(): Setup complete\n";
          fprintf(_stdout,"[INFO ] %s:%d %s(): Setup complete\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                  ,0x12e,"virtio_legacy_init");
          uVar6 = read_io8(iVar10,(size_t)pcVar12);
          if (uVar6 != 0x80) {
            virtio_legacy_set_promiscuous(dev,true);
            return &dev->ixy;
          }
          pcVar12 = "[ERROR] %s:%d %s(): Device signaled unrecoverable error\n";
          pcVar19 = "virtio_legacy_check_status";
          uStackY_60 = 0x1a;
        }
        else {
          pcVar12 = "[ERROR] %s:%d %s(): Device does not support required features\n";
          pcVar19 = "virtio_legacy_init";
          uStackY_60 = 0x121;
        }
      }
      else {
        pcVar12 = "[ERROR] %s:%d %s(): Modern device not supported\n";
        pcVar19 = "virtio_init";
        uStackY_60 = 0x164;
      }
      fprintf(_stderr,pcVar12,
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,uStackY_60,pcVar19);
      abort();
    }
    uVar16 = (ulong)tx_queues;
    pcVar12 = "[ERROR] %s:%d %s(): cannot configure %d tx queues: limit is %d\n";
    uVar17 = 0x14d;
  }
  else {
    uVar16 = (ulong)rx_queues;
    pcVar12 = "[ERROR] %s:%d %s(): cannot configure %d rx queues: limit is %d\n";
    uVar17 = 0x14a;
  }
  fprintf(_stderr,pcVar12,
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          uVar17,"virtio_init",uVar16,CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),1));
  abort();
}

Assistant:

struct ixy_device* virtio_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > 1) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, 1);
	}
	if (tx_queues > 1) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, 1);
	}
	remove_driver(pci_addr);
	struct virtio_device* dev = calloc(1, sizeof(*dev));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = virtio_rx_batch;
	dev->ixy.tx_batch = virtio_tx_batch;
	dev->ixy.read_stats = virtio_read_stats;
	dev->ixy.set_promisc = virtio_set_promisc;
	dev->ixy.get_link_speed = virtio_get_link_speed;
	enable_dma(pci_addr);
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t device_id = read_io16(config, 2);
	close(config);
	// Check config if device is legacy network card
	if (device_id == 0x1000) {
		info("Detected virtio legacy network card");
		dev->fd = pci_open_resource(pci_addr, "resource0", O_RDWR);
		virtio_legacy_init(dev);
	} else {
		error("Modern device not supported");
	}
	return &dev->ixy;
}